

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

void __thiscall
t_haxe_generator::generate_serialize_map_element
          (t_haxe_generator *this,ostream *out,t_map *tmap,string *iter,string *map)

{
  t_type *ptVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  t_field vfield;
  t_field kfield;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  t_field local_190;
  t_field local_e0;
  
  ptVar1 = tmap->key_type_;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  pcVar2 = (iter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + iter->_M_string_length);
  t_field::t_field(&local_e0,ptVar1,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  generate_serialize_field(this,out,&local_e0,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  ptVar1 = tmap->val_type_;
  pcVar2 = (map->_M_dataplus)._M_p;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_250,pcVar2,pcVar2 + map->_M_string_length);
  std::__cxx11::string::append((char *)local_250);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_250,(ulong)(iter->_M_dataplus)._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_220 = *plVar4;
    lStack_218 = plVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar4;
    local_230 = (long *)*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_210.field_2._M_allocated_capacity = *psVar5;
    local_210.field_2._8_8_ = plVar3[3];
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar5;
    local_210._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_210._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  t_field::t_field(&local_190,ptVar1,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  generate_serialize_field(this,out,&local_190,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  return;
}

Assistant:

void t_haxe_generator::generate_serialize_map_element(ostream& out,
                                                      t_map* tmap,
                                                      string iter,
                                                      string map) {
  t_field kfield(tmap->get_key_type(), iter);
  generate_serialize_field(out, &kfield, "");
  t_field vfield(tmap->get_val_type(), map + ".get(" + iter + ")");
  generate_serialize_field(out, &vfield, "");
}